

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuItem>::emplace<QDBusMenuItem_const&>
          (QMovableArrayOps<QDBusMenuItem> *this,qsizetype i,QDBusMenuItem *args)

{
  QDBusMenuItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QDBusMenuItem *pQVar4;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar5;
  qsizetype qVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_68;
  int local_40;
  undefined4 uStack_3c;
  QVariantMap local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size ==
        i) {
      qVar6 = QArrayDataPointer<QDBusMenuItem>::freeSpaceAtEnd
                        ((QArrayDataPointer<QDBusMenuItem> *)this);
      if (qVar6 != 0) {
        pQVar4 = (this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
        lVar7 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>
                .size;
        pQVar4[lVar7].m_id = args->m_id;
        pQVar5 = (args->m_properties).d.d.ptr;
        pQVar4[lVar7].m_properties.d.d.ptr = pQVar5;
        if (pQVar5 != (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                       *)0x0) {
          LOCK();
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value = (Type)((int)(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
                                 super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
          lVar7 = (this->super_QGenericArrayOps<QDBusMenuItem>).
                  super_QArrayDataPointer<QDBusMenuItem>.size;
        }
        (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size =
             lVar7 + 1;
        goto LAB_00590a39;
      }
    }
    if (i == 0) {
      qVar6 = QArrayDataPointer<QDBusMenuItem>::freeSpaceAtBegin
                        ((QArrayDataPointer<QDBusMenuItem> *)this);
      if (qVar6 != 0) {
        pQVar4 = (this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
        pQVar4[-1].m_id = args->m_id;
        pQVar5 = (args->m_properties).d.d.ptr;
        pQVar4[-1].m_properties.d.d.ptr = pQVar5;
        if (pQVar5 != (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                       *)0x0) {
          LOCK();
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value = (Type)((int)(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
                                 super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                   super_QArrayDataPointer<QDBusMenuItem>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                  super_QArrayDataPointer<QDBusMenuItem>.size;
        *pqVar2 = *pqVar2 + 1;
        goto LAB_00590a39;
      }
    }
  }
  _local_40 = CONCAT44(0xaaaaaaaa,args->m_id);
  local_38.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )(args->m_properties).d.d.ptr;
  if (local_38.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_38.d.d.ptr = *(int *)local_38.d.d.ptr + 1;
    UNLOCK();
  }
  bVar8 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size
          != 0;
  QArrayDataPointer<QDBusMenuItem>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuItem> *)this,(uint)(i == 0 && bVar8),1,
             (QDBusMenuItem **)0x0,(QArrayDataPointer<QDBusMenuItem> *)0x0);
  if (i == 0 && bVar8) {
    pQVar4 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             ptr;
    pQVar4[-1].m_id = local_40;
    pQVar4[-1].m_properties.d.d.ptr =
         (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          *)local_38.d.d.ptr;
    ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_68,(QArrayDataPointer<QDBusMenuItem> *)this,i,1);
    (local_68.displaceFrom)->m_id = local_40;
    ((local_68.displaceFrom)->m_properties).d.d.ptr =
         (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          *)local_38.d.d.ptr;
    local_68.displaceFrom = local_68.displaceFrom + 1;
    (local_68.data)->size = (local_68.data)->size + local_68.nInserts;
  }
  local_38.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
          )0x0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_38.d);
LAB_00590a39:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }